

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

bool CSOAA::ec_seq_is_label_definition(multi_ex *ec_seq)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  undefined8 uVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  stringstream __msg;
  size_t i;
  bool is_lab;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  example *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1a8 [16];
  ostream local_198;
  ulong local_20;
  byte local_11;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
  if (sVar4 == 0) {
    local_1 = false;
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,0);
    local_11 = ec_is_label_definition(in_stack_fffffffffffffe38);
    local_20 = 1;
    while( true ) {
      uVar1 = local_20;
      sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
      if (sVar4 <= uVar1) break;
      bVar2 = (bool)(local_11 & 1);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
      bVar3 = ec_is_label_definition(in_stack_fffffffffffffe38);
      if (bVar2 != bVar3) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::operator<<(&local_198,"error: mixed label definition and examples in ldf data!");
        uVar5 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                   in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
        __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_20 = local_20 + 1;
    }
    local_1 = (bool)(local_11 & 1);
  }
  return local_1;
}

Assistant:

bool ec_seq_is_label_definition(multi_ex& ec_seq)
{
  if (ec_seq.size() == 0)
    return false;
  bool is_lab = ec_is_label_definition(*ec_seq[0]);
  for (size_t i = 1; i < ec_seq.size(); i++)
    if (is_lab != ec_is_label_definition(*ec_seq[i]))
      THROW("error: mixed label definition and examples in ldf data!");
  return is_lab;
}